

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O1

Remotes * Omega_h::form_down_use_owners
                    (Remotes *__return_storage_ptr__,Mesh *mesh,Int high_dim,Int low_dim)

{
  int *piVar1;
  Alloc *pAVar2;
  LOs uses2lows;
  Remotes lows2owners;
  Alloc *local_90;
  LOs local_80;
  Remotes local_70;
  Adj local_50;
  
  Mesh::ask_down(&local_50,mesh,high_dim,low_dim);
  local_80.write_.shared_alloc_.direct_ptr =
       local_50.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_90 = local_50.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if ((((ulong)local_50.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
       local_50.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (local_50.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
         (local_50.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + -1;
    local_90 = (Alloc *)((local_50.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_50.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_50.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)0x0;
  Adj::~Adj(&local_50);
  Mesh::ask_owners((Remotes *)&local_50,mesh,low_dim);
  local_80.write_.shared_alloc_.alloc = local_90;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  local_70.ranks.write_.shared_alloc_.alloc = local_50.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_50.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.ranks.write_.shared_alloc_.alloc =
           (Alloc *)((local_50.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_50.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_50.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.ranks.write_.shared_alloc_.direct_ptr =
       local_50.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_70.idxs.write_.shared_alloc_.alloc = local_50.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_50.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.idxs.write_.shared_alloc_.alloc =
           (Alloc *)((local_50.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_50.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_50.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.idxs.write_.shared_alloc_.direct_ptr =
       local_50.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  unmap(__return_storage_ptr__,&local_80,&local_70);
  pAVar2 = local_70.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_70.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_70.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_70.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.ranks.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_50.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_50.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.super_Graph.ab2b.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_50.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.super_Graph.a2ab.write_.shared_alloc_.alloc);
      operator_delete(local_50.super_Graph.a2ab.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    piVar1 = &local_90->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90);
      operator_delete(local_90,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Remotes form_down_use_owners(Mesh* mesh, Int high_dim, Int low_dim) {
  auto uses2lows = mesh->ask_down(high_dim, low_dim).ab2b;
  auto lows2owners = mesh->ask_owners(low_dim);
  return unmap(uses2lows, lows2owners);
}